

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::SetIsPrototype(PathTypeHandlerBase *this,DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint16 uVar4;
  DynamicType *oldType_00;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  ScriptContext *pSVar5;
  DynamicType *pDVar6;
  DynamicTypeHandler *this_00;
  undefined4 *puVar7;
  PathTypeHandlerBase *newTypeHandler;
  DynamicType *pDVar8;
  DynamicTypeHandler *typeHandler;
  DynamicType *oldType;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstance;
  DynamicType *oldTypeDebug;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  bVar2 = DynamicTypeHandler::ChangeTypeOnProto();
  if ((bVar2) ||
     ((bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler), bVar2 &&
      (bVar2 = DynamicTypeHandler::IsolatePrototypes(), bVar2)))) {
    oldType_00 = DynamicObject::GetDynamicType(instance);
    oldSingletonInstanceBefore = GetSingletonInstance(this);
    bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
    if ((bVar2) && (bVar2 = DynamicTypeHandler::IsolatePrototypes(), bVar2)) {
      pDVar8 = DynamicObject::GetDynamicType(instance);
      pSVar5 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      pSVar5->convertPathToDictionaryProtoCount = pSVar5->convertPathToDictionaryProtoCount + 1;
      uVar4 = GetPathLength(this);
      TryConvertToSimpleDictionaryType(this,instance,(uint)uVar4,false);
      bVar2 = DynamicTypeHandler::ChangeTypeOnProto();
      if ((bVar2) && (pDVar6 = DynamicObject::GetDynamicType(instance), pDVar6 == pDVar8)) {
        DynamicObject::ChangeType(instance);
      }
    }
    else {
      TraceFixedFieldsBeforeSetIsProto
                (instance,&this->super_DynamicTypeHandler,oldType_00,oldSingletonInstanceBefore);
      bVar2 = DynamicTypeHandler::ChangeTypeOnProto();
      if ((bVar2) &&
         ((bVar3 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler),
          (bVar3 & 0x20) == 0 ||
          ((bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler), bVar2 &&
           (bVar2 = DynamicTypeHandler::IsolatePrototypes(), !bVar2)))))) {
        bVar2 = DynamicObject::HasSharedType(instance);
        if (bVar2) {
          pDVar8 = DynamicObject::GetDynamicType(instance);
          this_00 = DynamicType::GetTypeHandler(pDVar8);
          bVar2 = DynamicTypeHandler::GetIsShared(this_00);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0xb8f,
                                        "(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared())"
                                        ,
                                        "!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared()"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
        DynamicObject::ChangeType(instance);
        bVar2 = DynamicObject::HasLockedType(instance);
        if ((bVar2) || (bVar2 = DynamicObject::HasSharedType(instance), bVar2)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xb92,
                                      "(!instance->HasLockedType() && !instance->HasSharedType())",
                                      "!instance->HasLockedType() && !instance->HasSharedType()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
    }
    newTypeHandler = (PathTypeHandlerBase *)DynamicTypeHandler::GetCurrentTypeHandler(instance);
    if (newTypeHandler == this) {
      DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
      pDVar8 = DynamicObject::GetDynamicType(instance);
      TraceFixedFieldsAfterSetIsProto
                (instance,&this->super_DynamicTypeHandler,(DynamicTypeHandler *)newTypeHandler,
                 oldType_00,pDVar8,oldSingletonInstanceBefore);
    }
    else {
      (*(newTypeHandler->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x52])
                (newTypeHandler,instance);
    }
  }
  else {
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler is shared, this instance may not even be a prototype yet.
        // In this case we may need to convert to a non-shared type handler.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            SetFlags(IsPrototypeFlag);
            return;
        }

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldTypeDebug = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
#endif
#endif

        if ((GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            // The type coming in may not be shared or even locked (i.e. might have been created via DynamicObject::ChangeType()).
            // In that case the type handler change below won't change the type on the object, so we have to force it.

            DynamicType* oldType = instance->GetDynamicType();
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryProtoCount++;
#endif
            TryConvertToSimpleDictionaryType(instance, GetPathLength());

            if (ChangeTypeOnProto() && instance->GetDynamicType() == oldType)
            {
                instance->ChangeType();
            }
        }
        else
        {
#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsBeforeSetIsProto(instance, this, oldTypeDebug, oldSingletonInstance);
#endif
#endif

            if (ChangeTypeOnProto())
            {
                // If this handler is shared and we don't isolate prototypes, it's possible that the handler has
                // the prototype flag, but this instance may not yet be a prototype and may not have taken
                // the required type transition.  It would be nice to have a reliable flag on the object
                // indicating whether it's a prototype to avoid multiple type transitions if the same object
                // with shared type handler is used as prototype multiple times.
                if (((GetFlags() & IsPrototypeFlag) == 0) || (GetIsShared() && !IsolatePrototypes()))
                {
                    // We're about to split out the type.  If the original type was shared the handler better be shared as well.
                    // Otherwise, the handler would lose track of being shared between different types and instances.
                    Assert(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared());

                    instance->ChangeType();
                    Assert(!instance->HasLockedType() && !instance->HasSharedType());
                }
            }
        }

        DynamicTypeHandler* typeHandler = GetCurrentTypeHandler(instance);
        if (typeHandler != this)
        {
            typeHandler->SetIsPrototype(instance);
        }
        else
        {
            SetFlags(IsPrototypeFlag);

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterSetIsProto(instance, this, typeHandler, oldTypeDebug, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

        }
    }